

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O1

vector<float,_std::allocator<float>_> * __thiscall
gl3cts::ClipDistance::Utility::Framebuffer::readPixels
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,Framebuffer *this)

{
  GLenum err;
  allocator_type local_11;
  
  std::vector<float,_std::allocator<float>_>::vector
            (__return_storage_ptr__,(long)(this->m_size_y * this->m_size_x),&local_11);
  if ((0 < this->m_size_x) && (0 < this->m_size_y)) {
    (*this->m_gl->readPixels)
              (0,0,this->m_size_x,this->m_size_y,0x1903,0x1406,
               (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start);
    err = (*this->m_gl->getError)();
    glu::checkError(err,"glReadPixels call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                    ,0x60f);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<glw::GLfloat> gl3cts::ClipDistance::Utility::Framebuffer::readPixels()
{
	std::vector<glw::GLfloat> pixels(m_size_x * m_size_y);

	if ((m_size_x > 0) && (m_size_y > 0))
	{
		m_gl.readPixels(0, 0, m_size_x, m_size_y, GL_RED, GL_FLOAT, pixels.data());
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glReadPixels call failed.");
	}

	return pixels;
}